

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

LLVMPointer __thiscall dg::DGLLVMPointsToSet::getKnownSingleton(DGLLVMPointsToSet *this)

{
  Value *val;
  Pointer ptr;
  const_iterator *in_stack_ffffffffffffffa8;
  undefined1 local_40 [32];
  Offset local_20;
  LLVMPointer local_10;
  
  pta::PointerIdPointsToSet::begin((PointerIdPointsToSet *)local_40);
  join_0x00000010_0x00000000_ =
       pta::PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffffa8);
  val = SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
                  ((SubgraphNode<dg::pta::PSNode> *)(local_40._24_8_ + 8));
  LLVMPointer::LLVMPointer(&local_10,val,local_20);
  return local_10;
}

Assistant:

LLVMPointer getKnownSingleton() const override {
        assert(isKnownSingleton());
        auto ptr = (*(PTSet.begin()));
        return {ptr.target->getUserData<llvm::Value>(), ptr.offset};
    }